

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzplane.cpp
# Opt level: O1

int __thiscall
TPZPlane::SetPlane(TPZPlane *this,TPZVec<double> *p1,TPZVec<double> *p2,TPZVec<double> *p3)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  double *pdVar16;
  ulong uVar17;
  double dVar18;
  REAL RVar19;
  REAL RVar20;
  REAL RVar21;
  TPZVec<double> aux;
  TPZVec<double> desloc2;
  TPZVec<double> desloc1;
  REAL matrix [3] [3];
  REAL sol [3];
  int ordem [3];
  REAL matrix2 [3] [3];
  TPZVec<double> local_158;
  TPZVec<double> local_138;
  TPZVec<double> local_118;
  double local_f8 [14];
  int local_84 [3];
  REAL local_78 [3];
  double adStack_60 [6];
  
  TPZVec<double>::TPZVec(&local_118,3);
  TPZVec<double>::TPZVec(&local_138,3);
  TPZVec<double>::TPZVec(&local_158,3);
  pdVar2 = p1->fStore;
  pdVar16 = p2->fStore;
  pdVar3 = p3->fStore;
  lVar15 = 0;
  do {
    local_118.fStore[lVar15] = pdVar2[lVar15] - pdVar16[lVar15];
    local_138.fStore[lVar15] = pdVar16[lVar15] - pdVar3[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  TPZNumeric::ProdVetorial<double>(&local_118,&local_138,&local_158);
  pdVar2 = local_158.fStore;
  dVar18 = 0.0;
  lVar15 = 0;
  do {
    dVar18 = dVar18 + *(double *)((long)local_158.fStore + lVar15) *
                      *(double *)((long)local_158.fStore + lVar15);
    lVar15 = lVar15 + 8;
  } while (lVar15 != 0x18);
  if (dVar18 <= 1e-10) {
    iVar10 = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TPZPlane::SetPlane - Error: Colinear points can\'t define a single plane\n",0x48);
  }
  else {
    pdVar3 = p1->fStore;
    pdVar4 = p2->fStore;
    pdVar5 = p3->fStore;
    lVar15 = 1;
    pdVar16 = local_f8 + 2;
    do {
      local_f8[0] = pdVar3[lVar15 + -1];
      lVar11 = lVar15;
      if (lVar15 == 3) {
        lVar11 = 0;
      }
      local_f8[1] = pdVar3[lVar11];
      local_f8[3] = pdVar4[lVar15 + -1];
      local_f8[4] = pdVar4[lVar11];
      local_f8[6] = pdVar5[lVar15 + -1];
      local_f8[7] = pdVar5[lVar11];
      *pdVar16 = 1.0;
      RVar19 = MatrixDet((REAL (*) [3])local_f8);
      pdVar2[lVar15 + -1] = RVar19;
      lVar15 = lVar15 + 1;
      pdVar16 = pdVar16 + 3;
    } while (lVar15 != 4);
    TPZNumeric::SortArray3<double>(&local_158,local_84);
    iVar13 = ((local_84[0] + 1) / 3) * -3 + local_84[0] + 1;
    iVar14 = ((local_84[0] + 2) / 3) * -3 + local_84[0] + 2;
    iVar10 = local_84[0] % 3;
    pdVar2 = p1->fStore;
    local_f8[0] = pdVar2[iVar10];
    local_f8[1] = pdVar2[iVar13];
    pdVar16 = p2->fStore;
    local_f8[3] = pdVar16[iVar10];
    local_f8[4] = pdVar16[iVar13];
    local_f8[6] = p3->fStore[iVar10];
    local_f8[7] = p3->fStore[iVar13];
    RVar19 = pdVar2[iVar14];
    dVar18 = pdVar16[iVar14];
    RVar20 = MatrixDet((REAL (*) [3])local_f8);
    uVar17 = 2;
    lVar15 = 0;
    do {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar17;
      uVar7 = SUB168(auVar6 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x3ffffffffffffffe;
      lVar8 = uVar7 * -0xc;
      lVar9 = uVar7 * -0xc;
      local_78[lVar15] = -RVar19;
      adStack_60[lVar15] = -dVar18;
      adStack_60[lVar15 + 3] = -dVar18;
      lVar11 = lVar15 + 1;
      lVar12 = 0;
      if (lVar15 != 2) {
        lVar12 = lVar11;
      }
      dVar1 = local_f8[lVar12 + 3];
      local_78[lVar12] = local_f8[lVar12];
      adStack_60[lVar12] = dVar1;
      adStack_60[lVar12 + 3] = local_f8[lVar12 + 6];
      *(undefined8 *)((long)adStack_60 + lVar15 * 8 + lVar9 + -8) =
           *(undefined8 *)((long)local_f8 + lVar15 * 8 + lVar8 + 0x10);
      *(undefined8 *)((long)adStack_60 + lVar15 * 8 + lVar9 + 0x10) =
           *(undefined8 *)((long)local_f8 + lVar15 * 8 + lVar8 + 0x28);
      *(undefined8 *)((long)adStack_60 + lVar15 * 8 + lVar9 + 0x28) =
           *(undefined8 *)((long)local_f8 + lVar15 * 8 + lVar8 + 0x40);
      RVar21 = MatrixDet(&local_78);
      local_f8[lVar15 + 10] = RVar21 / RVar20;
      uVar17 = uVar17 + 1;
      lVar15 = lVar11;
    } while (lVar11 != 3);
    pdVar2 = (this->fCoef).fStore;
    pdVar2[iVar10] = local_f8[10];
    pdVar2[iVar13] = local_f8[0xb];
    pdVar2[iVar14] = 1.0;
    pdVar2[3] = local_f8[0xc];
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    iVar10 = 1;
    std::ostream::flush();
  }
  local_158._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_158.fStore != (double *)0x0) {
    operator_delete__(local_158.fStore);
  }
  local_138._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_138.fStore != (double *)0x0) {
    operator_delete__(local_138.fStore);
  }
  local_118._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_118.fStore != (double *)0x0) {
    operator_delete__(local_118.fStore);
  }
  return iVar10;
}

Assistant:

int TPZPlane::SetPlane(const TPZVec<REAL> &p1, const TPZVec<REAL> &p2,const TPZVec<REAL> &p3){
	REAL matrix[3][3];
	TPZVec<REAL> desloc1(3), desloc2(3);
	TPZVec<REAL> aux(3);
	int i ;
	
	for(i=0; i<3;i++){
		desloc1[i] = p1[i]- p2[i];
		desloc2[i] = p2[i]-p3[i];
	}  
	TPZNumeric::ProdVetorial(desloc1, desloc2, aux);
	REAL norm = inner_product(&aux[0], &aux[3], &aux[0], REAL(0.0));
	if(norm <= 1e-10){
		cerr << "TPZPlane::SetPlane - Error: Colinear points can't define a single plane\n";
		return 0;
	}
	else{
		for(i=0; i<3;i++){
			matrix[0][0]=p1[i%3];
			matrix[0][1]=p1[(i+1)%3];
			matrix[1][0]=p2[i%3];
			matrix[1][1]=p2[(i+1)%3];
			matrix[2][0]=p3[i%3];
			matrix[2][1]=p3[(i+1)%3];
			matrix[i][2]=1.0;
			MatrixDet(matrix, aux[i]);
		}
		
		int ordem[3];
		REAL vect[3];
		TPZNumeric::SortArray3(aux,ordem);
		i=ordem[0];
		
		matrix[0][0]=p1[i%3];
		matrix[0][1]=p1[(i+1)%3];
		matrix[1][0]=p2[i%3];
		matrix[1][1]=p2[(i+1)%3];
		matrix[2][0]=p3[i%3];
		matrix[2][1]=p3[(i+1)%3];
		vect[0]=-p1[(i+2)%3];
		vect[1]=-p2[(i+2)%3];
		vect[2]=-p2[(i+2)%3];
		
		REAL matrix2[3][3];
		REAL sol[3];
		
		for(i=0; i<3;i++){
			matrix2[0][i%3]=vect[0];
			matrix2[1][i%3]=vect[1];
			matrix2[2][i%3]=vect[2];
			matrix2[0][(i+1)%3]=matrix[0][(i+1)%3];
			matrix2[1][(i+1)%3]=matrix[1][(i+1)%3];
			matrix2[2][(i+1)%3]=matrix[2][(i+1)%3];
			matrix2[0][(i+2)%3]=matrix[0][(i+2)%3];
			matrix2[1][(i+2)%3]=matrix[1][(i+2)%3];
			matrix2[2][(i+2)%3]=matrix[2][(i+2)%3];
			
			sol[i]=MatrixDet(matrix2)/MatrixDet(matrix);
		}
		fCoef[(ordem[0])%3]=sol[0];
		fCoef[(ordem[0]+1)%3]=sol[1];
		fCoef[(ordem[0]+2)%3]= 1.0;
		fCoef[3]=sol[2];
	}
	cout <<endl;
	return 1;	
}